

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_99087a::HandleSublistCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  cmMakefile *this;
  bool bVar3;
  long lVar4;
  string *name;
  string_view value;
  int length;
  int start;
  optional<cmList> list;
  cmList sublist;
  string local_80;
  int local_60;
  int local_5c;
  _Storage<cmList,_false> local_58;
  char local_40;
  cmList local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pbVar2 - (long)pbVar1;
  if (lVar4 != 0xa0) {
    local_80._M_dataplus._M_p = (pointer)((lVar4 >> 5) + -1);
    cmStrCat<char_const(&)[46],unsigned_long,char_const(&)[9]>
              ((string *)&local_58._M_value,
               (char (*) [46])"sub-command SUBLIST requires four arguments (",
               (unsigned_long *)&local_80,(char (*) [9])" found).");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_58._M_value);
    return false;
  }
  name = pbVar2 + -1;
  GetList((optional<cmList> *)&local_58._M_value,pbVar1 + 1,status->Makefile);
  if ((local_40 == '\x01') &&
     (local_58._M_value.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58._M_value.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    bVar3 = GetIndexArg((args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 2,&local_5c,status->Makefile);
    if (bVar3) {
      bVar3 = GetIndexArg((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 3,&local_60,status->Makefile)
      ;
      if (bVar3) {
        if ((long)local_5c < 0) {
          local_38.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)(((long)local_58._M_value.Values.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - local_58._0_8_ >> 5) +
                        -1);
          cmStrCat<char_const(&)[14],int&,char_const(&)[22],unsigned_long>
                    (&local_80,(char (*) [14])"begin index: ",&local_5c,
                     (char (*) [22])" is out of range 0 - ",(unsigned_long *)&local_38);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        else {
          if (-2 < (long)local_60) {
            cmList::sublist(&local_38,&local_58._M_value,(long)local_5c,(long)local_60);
            this = status->Makefile;
            cmList::to_string_abi_cxx11_(&local_80,&local_38);
            value._M_str = local_80._M_dataplus._M_p;
            value._M_len = local_80._M_string_length;
            cmMakefile::AddDefinition(this,name,value);
            std::__cxx11::string::~string((string *)&local_80);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_38.Values);
            bVar3 = true;
            goto LAB_002aefef;
          }
          cmStrCat<char_const(&)[9],int&,char_const(&)[25]>
                    (&local_80,(char (*) [9])"length: ",&local_60,
                     (char (*) [25])" should be -1 or greater");
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
      }
      else {
        cmStrCat<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[22]>
                  (&local_80,(char (*) [8])0x6896fa,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 3,(char (*) [22])0x6d451a);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
    else {
      cmStrCat<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[22]>
                (&local_80,(char (*) [8])0x6896fa,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 2,(char (*) [22])0x6d451a);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    std::__cxx11::string::~string((string *)&local_80);
    bVar3 = false;
  }
  else {
    bVar3 = true;
    cmMakefile::AddDefinition(status->Makefile,name,(string_view)(ZEXT816(0x70a819) << 0x40));
  }
LAB_002aefef:
  std::_Optional_payload_base<cmList>::_M_reset
            ((_Optional_payload_base<cmList> *)&local_58._M_value);
  return bVar3;
}

Assistant:

bool HandleSublistCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() != 5) {
    status.SetError(cmStrCat("sub-command SUBLIST requires four arguments (",
                             args.size() - 1, " found)."));
    return false;
  }

  const std::string& listName = args[1];
  const std::string& variableName = args.back();

  // expand the variable
  auto list = GetList(listName, status.GetMakefile());

  if (!list || list->empty()) {
    status.GetMakefile().AddDefinition(variableName, "");
    return true;
  }

  int start;
  int length;
  if (!GetIndexArg(args[2], &start, status.GetMakefile())) {
    status.SetError(cmStrCat("index: ", args[2], " is not a valid index"));
    return false;
  }
  if (!GetIndexArg(args[3], &length, status.GetMakefile())) {
    status.SetError(cmStrCat("index: ", args[3], " is not a valid index"));
    return false;
  }

  if (start < 0) {
    status.SetError(cmStrCat("begin index: ", start, " is out of range 0 - ",
                             list->size() - 1));
    return false;
  }
  if (length < -1) {
    status.SetError(cmStrCat("length: ", length, " should be -1 or greater"));
    return false;
  }

  using size_type = cmList::size_type;

  try {
    auto sublist = list->sublist(static_cast<size_type>(start),
                                 static_cast<size_type>(length));
    status.GetMakefile().AddDefinition(variableName, sublist.to_string());
    return true;
  } catch (std::out_of_range& e) {
    status.SetError(e.what());
    return false;
  }
}